

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

work_t __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
          (Image<float,_gimage::PixelTraits<float>_> *this,float x,float y,int j)

{
  bool bVar1;
  int *piVar2;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  work_t ret;
  store_t_conflict1 p3;
  store_t_conflict1 p2;
  store_t_conflict1 p1;
  store_t_conflict1 p0;
  long k;
  long i;
  store_t_conflict1 in_stack_ffffffffffffffac;
  int local_44 [2];
  work_t_conflict local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  long local_28;
  long local_20;
  int local_14;
  float local_10;
  float local_c;
  
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  local_3c = PixelTraits<float>::invalid();
  local_44[1] = 0;
  piVar2 = std::max<int>(local_44 + 1,&local_14);
  local_14 = *piVar2;
  local_44[0] = in_RDI->depth + -1;
  piVar2 = std::min<int>(local_44,&local_14);
  local_14 = *piVar2;
  local_c = local_c - 0.5;
  local_10 = local_10 - 0.5;
  if (local_c < 0.0) {
    local_c = 0.0;
  }
  if (local_10 < 0.0) {
    local_10 = 0.0;
  }
  if ((float)(in_RDI->width + -1) <= local_c) {
    local_c = (float)in_RDI->width - 1.001;
  }
  if ((float)(in_RDI->height + -1) <= local_10) {
    local_10 = (float)in_RDI->height - 1.001;
  }
  local_20 = (long)local_c;
  local_28 = (long)local_10;
  local_c = local_c - (float)local_20;
  local_10 = local_10 - (float)local_28;
  local_2c = in_RDI->img[local_14][local_28][local_20];
  local_30 = in_RDI->img[local_14][local_28][local_20 + 1];
  local_34 = in_RDI->img[local_14][local_28 + 1][local_20];
  local_38 = in_RDI->img[local_14][local_28 + 1][local_20 + 1];
  bVar1 = isValidS(in_RDI,in_stack_ffffffffffffffac);
  if ((((bVar1) && (bVar1 = isValidS(in_RDI,in_stack_ffffffffffffffac), bVar1)) &&
      (bVar1 = isValidS(in_RDI,in_stack_ffffffffffffffac), bVar1)) &&
     (bVar1 = isValidS(in_RDI,in_stack_ffffffffffffffac), bVar1)) {
    local_c = local_c * 4.0;
    local_10 = local_10 * 4.0;
    local_3c = (local_38 * local_c * local_10 +
               local_34 * (4.0 - local_c) * local_10 +
               local_2c * (4.0 - local_c) * (4.0 - local_10) + local_30 * local_c * (4.0 - local_10)
               ) / 16.0;
  }
  return local_3c;
}

Assistant:

work_t getBilinear(float x, float y, int j=0) const
    {
      long    i, k;
      store_t p0, p1, p2, p3;
      work_t  ret=ptraits::invalid();

      j=std::max(0, j);
      j=std::min(depth-1, j);

      x-=0.5f;
      y-=0.5f;

      if (x < 0)
      {
        x=0;
      }

      if (y < 0)
      {
        y=0;
      }

      if (x >= width-1)
      {
        x=width-1.001f;
      }

      if (y >= height-1)
      {
        y=height-1.001f;
      }

      i=static_cast<long>(x);
      k=static_cast<long>(y);

      x-=i;
      y-=k;

      p0=img[j][k][i];
      p1=img[j][k][i+1];
      p2=img[j][k+1][i];
      p3=img[j][k+1][i+1];

      if (isValidS(p0) && isValidS(p1) && isValidS(p2) && isValidS(p3))
      {
        x*=4;
        y*=4;

        ret=static_cast<work_t>(p0*(4-x)*(4-y)+p1*x*(4-y)+p2*(4-x)*y+p3*x*y);
        ret/=16;
      }

      return ret;
    }